

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.h
# Opt level: O0

void __thiscall despot::util::tinyxml::TiXmlText::TiXmlText(TiXmlText *this,char *initValue)

{
  char *initValue_local;
  TiXmlText *this_local;
  
  TiXmlNode::TiXmlNode(&this->super_TiXmlNode,TEXT);
  (this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase = (_func_int **)&PTR__TiXmlText_0026f6a8;
  TiXmlNode::SetValue(&this->super_TiXmlNode,initValue);
  this->cdata = false;
  return;
}

Assistant:

TiXmlText(const char * initValue) :
		TiXmlNode(TiXmlNode::TEXT) {
		SetValue(initValue);
		cdata = false;
	}